

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_encoder.hpp
# Opt level: O2

bool __thiscall
jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_string(basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
            string_view_type *sv,semantic_tag tag,ser_context *param_3,error_code *ec)

{
  size_t *psVar1;
  pointer psVar2;
  bool bVar3;
  int64_t iVar4;
  int64_t iVar5;
  int iVar6;
  undefined7 in_register_00000011;
  long lVar7;
  type tVar8;
  int64_t seconds;
  bigint rem;
  bigint q;
  basic_bigint<std::allocator<unsigned_char>_> local_60;
  basic_bigint<std::allocator<unsigned_char>_> local_38;
  
  iVar6 = (int)CONCAT71(in_register_00000011,tag);
  if (iVar6 == 7) {
    basic_bigint<std::allocator<unsigned_char>_>::from_string<char>
              ((basic_bigint<std::allocator<unsigned_char>_> *)&seconds,sv->_M_str,sv->_M_len);
    bVar3 = jsoncons::operator!=((basic_bigint<std::allocator<unsigned_char>_> *)&seconds,0);
    if (!bVar3) {
      write_timestamp(this,0,0);
      goto LAB_0043a908;
    }
    q.field_0._0_1_ = 0;
    q.field_0.common_stor_.length_ = 0;
    q.field_0.short_stor_.values_[0] = 0;
    q.field_0.short_stor_.values_[1] = 0;
    rem.field_0._0_1_ = 0;
    rem.field_0.short_stor_.values_[1] = 0;
    rem.field_0.common_stor_.length_ = 0;
    rem.field_0.short_stor_.values_[0] = 0;
    local_60.field_0._0_1_ = 0;
    local_60.field_0.common_stor_.length_ = 1;
    local_60.field_0.short_stor_.values_[0] = 1000000000;
    local_60.field_0.short_stor_.values_[1] = 0;
    basic_bigint<std::allocator<unsigned_char>_>::divide
              ((basic_bigint<std::allocator<unsigned_char>_> *)&seconds,&local_60,&q,&rem,true);
    basic_bigint<std::allocator<unsigned_char>_>::destroy(&local_60);
    iVar4 = basic_bigint::operator_cast_to_long((basic_bigint *)&q);
    iVar5 = basic_bigint::operator_cast_to_long((basic_bigint *)&rem);
    lVar7 = -iVar5;
    if (0 < iVar5) {
      lVar7 = iVar5;
    }
    write_timestamp(this,iVar4,lVar7);
  }
  else {
    if (iVar6 != 6) {
      if (iVar6 != 5) {
        write_string_value(this,sv);
        psVar2 = (this->stack_).
                 super__Vector_base<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((this->stack_).
            super__Vector_base<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
            ._M_impl.super__Vector_impl_data._M_start == psVar2) {
          return true;
        }
        psVar1 = &psVar2[-1].index_;
        *psVar1 = *psVar1 + 1;
        return true;
      }
      tVar8 = detail::to_integer<long,char>(sv->_M_str,sv->_M_len,&seconds);
      if (tVar8.ec != success) {
        std::error_code::operator=(ec,invalid_timestamp);
        return true;
      }
      write_timestamp(this,seconds,0);
      return true;
    }
    basic_bigint<std::allocator<unsigned_char>_>::from_string<char>
              ((basic_bigint<std::allocator<unsigned_char>_> *)&seconds,sv->_M_str,sv->_M_len);
    bVar3 = jsoncons::operator!=((basic_bigint<std::allocator<unsigned_char>_> *)&seconds,0);
    if (!bVar3) {
      write_timestamp(this,0,0);
      goto LAB_0043a908;
    }
    q.field_0._0_1_ = 0;
    q.field_0.common_stor_.length_ = 0;
    q.field_0.short_stor_.values_[0] = 0;
    q.field_0.short_stor_.values_[1] = 0;
    rem.field_0._0_1_ = 0;
    rem.field_0.short_stor_.values_[1] = 0;
    rem.field_0.common_stor_.length_ = 0;
    rem.field_0.short_stor_.values_[0] = 0;
    local_38.field_0._0_1_ = 0;
    local_38.field_0.common_stor_.length_ = 1;
    local_38.field_0.short_stor_.values_[0] = 1000;
    local_38.field_0.short_stor_.values_[1] = 0;
    basic_bigint<std::allocator<unsigned_char>_>::divide
              ((basic_bigint<std::allocator<unsigned_char>_> *)&seconds,&local_38,&q,&rem,true);
    basic_bigint<std::allocator<unsigned_char>_>::destroy(&local_38);
    iVar4 = basic_bigint::operator_cast_to_long((basic_bigint *)&q);
    iVar5 = basic_bigint::operator_cast_to_long((basic_bigint *)&rem);
    lVar7 = iVar5 * -1000000;
    if (-1 < iVar5) {
      lVar7 = iVar5 * 1000000;
    }
    write_timestamp(this,iVar4,lVar7);
  }
  basic_bigint<std::allocator<unsigned_char>_>::destroy(&rem);
  basic_bigint<std::allocator<unsigned_char>_>::destroy(&q);
LAB_0043a908:
  basic_bigint<std::allocator<unsigned_char>_>::destroy
            ((basic_bigint<std::allocator<unsigned_char>_> *)&seconds);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_string(const string_view_type& sv, semantic_tag tag, const ser_context&, std::error_code& ec) final
        {
            switch (tag)
            {
                case semantic_tag::epoch_second:
                {
                    int64_t seconds;
                    auto result = jsoncons::detail::to_integer(sv.data(), sv.length(), seconds);
                    if (!result)
                    {
                        ec = msgpack_errc::invalid_timestamp;
                        JSONCONS_VISITOR_RETURN;
                    }
                    write_timestamp(seconds, 0);
                    break;
                }
                case semantic_tag::epoch_milli:
                {
                    bigint n = bigint::from_string(sv.data(), sv.length());
                    if (n != 0)
                    {
                        bigint q;
                        bigint rem;
                        n.divide(millis_in_second, q, rem, true);
                        auto seconds = static_cast<int64_t>(q);
                        auto nanoseconds = static_cast<int64_t>(rem) * nanos_in_milli;
                        if (nanoseconds < 0)
                        {
                            nanoseconds = -nanoseconds; 
                        }
                        write_timestamp(seconds, nanoseconds);
                    }
                    else
                    {
                        write_timestamp(0, 0);
                    }
                    break;
                }
                case semantic_tag::epoch_nano:
                {
                    bigint n = bigint::from_string(sv.data(), sv.length());
                    if (n != 0)
                    {
                        bigint q;
                        bigint rem;
                        n.divide(nanos_in_second, q, rem, true);
                        auto seconds = static_cast<int64_t>(q);
                        auto nanoseconds = static_cast<int64_t>(rem);
                        if (nanoseconds < 0)
                        {
                            nanoseconds = -nanoseconds; 
                        }
                        write_timestamp(seconds, nanoseconds);
                    }
                    else
                    {
                        write_timestamp(0, 0);
                    }
                    break;
                }
                default:
                {
                    write_string_value(sv);
                    end_value();
                    break;
                }
            }
            JSONCONS_VISITOR_RETURN;
        }